

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

int __thiscall kj::Canceler::AdapterBase::unlink(AdapterBase *this,char *__name)

{
  Maybe<kj::Canceler::AdapterBase_&> *pMVar1;
  AdapterBase *pAVar2;
  Maybe<kj::Canceler::AdapterBase_&> *p;
  AdapterBase *n;
  
  pMVar1 = (this->prev).ptr;
  if (pMVar1 != (Maybe<kj::Canceler::AdapterBase_&> *)0x0) {
    pMVar1->ptr = (this->next).ptr;
  }
  pAVar2 = (this->next).ptr;
  if (pAVar2 != (AdapterBase *)0x0) {
    (pAVar2->prev).ptr = pMVar1;
  }
  (this->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
  (this->next).ptr = (AdapterBase *)0x0;
  return (int)pMVar1;
}

Assistant:

inline T* readMaybe(const Maybe<T&>& maybe) { return maybe.ptr; }